

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::AMFImporter::Find_ConvertedMaterial
          (AMFImporter *this,string *pID,SPP_Material **pConvertedMaterial)

{
  __type _Var1;
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  *plVar2;
  _List_node_base *p_Var3;
  
  plVar2 = &this->mMaterial_Converted;
  p_Var3 = (_List_node_base *)plVar2;
  do {
    p_Var3 = (((_List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar2) goto LAB_003c3002;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var3 + 1),pID);
  } while (!_Var1);
  if (pConvertedMaterial != (SPP_Material **)0x0) {
    *pConvertedMaterial = (SPP_Material *)(p_Var3 + 1);
  }
LAB_003c3002:
  return p_Var3 != (_List_node_base *)plVar2;
}

Assistant:

bool AMFImporter::Find_ConvertedMaterial(const std::string& pID, const SPP_Material** pConvertedMaterial) const
{
	for(const SPP_Material& mat: mMaterial_Converted)
	{
		if(mat.ID == pID)
		{
			if(pConvertedMaterial != nullptr) *pConvertedMaterial = &mat;

			return true;
		}
	}// for(const SPP_Material& mat: mMaterial_Converted)

	return false;
}